

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head)

{
  cmTarget *pcVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  pointer pbVar3;
  __type _Var4;
  bool fromGenex;
  PolicyStatus PVar5;
  cmTargetLinkLibraryType cVar6;
  char *pcVar7;
  cmGeneratorTarget *pcVar8;
  ostream *poVar9;
  cmake *pcVar10;
  _Rb_tree_node_base *p_Var11;
  PolicyID id;
  const_iterator __rhs;
  string *item;
  MessageType t;
  pointer item_00;
  cmStringRange cVar12;
  cmBacktraceRange cVar13;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmListFileBacktrace *local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  const_iterator local_360;
  string name;
  string evaluated;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  cmListFileBacktrace local_2d0;
  string local_290;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  cmGeneratorTarget *local_250;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  cVar12 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  cVar13 = cmTarget::GetLinkImplementationBacktraces(this->Target);
  local_398 = (cmListFileBacktrace *)cVar13.Begin._M_current;
  do {
    local_360 = cVar12.End._M_current;
    __rhs = cVar12.Begin._M_current;
    if (__rhs._M_current == local_360._M_current) {
      pcVar10 = cmMakefile::GetCMakeInstance(this->Makefile);
      cmake::GetDebugConfigs_abi_cxx11_(&debugConfigs,pcVar10);
      cVar6 = CMP0003_ComputeLinkType(config,&debugConfigs);
      pcVar1 = this->Target;
      for (item_00 = (pcVar1->OriginalLinkLibraries).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          item_00 !=
          (pcVar1->OriginalLinkLibraries).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; item_00 = item_00 + 1) {
        if ((item_00->second != GENERAL_LibraryType) && (item_00->second != cVar6)) {
          CheckCMP0004((string *)&dagChecker,this,&item_00->first);
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&dagChecker,&this->Target->Name);
          if ((!_Var4) && (dagChecker.Target._M_dataplus._M_p != (pointer)0x0)) {
            pcVar8 = FindTargetToLink(this,(string *)&dagChecker);
            std::__cxx11::string::string((string *)&e,(string *)&dagChecker);
            local_250 = pcVar8;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (&(impl->super_cmLinkImplementation).super_cmLinkImplementationLibraries.
                        WrongConfigLibraries,(cmLinkItem *)&e);
            std::__cxx11::string::~string((string *)&e);
          }
          std::__cxx11::string::~string((string *)&dagChecker);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&debugConfigs);
      return;
    }
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    llibs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = this->Target;
    std::__cxx11::string::string((string *)&e,"LINK_LIBRARIES",(allocator *)&debugConfigs);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,&pcVar1->Name,(string *)&e,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&e);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&debugConfigs,local_398);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&e,(string *)&debugConfigs);
    cge.x_ = (cmCompiledGeneratorExpression *)_e;
    _e = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&e);
    _e = (pointer)&local_260;
    local_260._M_local_buf[0] = '\0';
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (cge.x_,this->LocalGenerator,config,false,head,&dagChecker,(string *)&e);
    std::__cxx11::string::string((string *)&evaluated,pcVar7,(allocator *)&local_2d0);
    std::__cxx11::string::~string((string *)&e);
    cmSystemTools::ExpandListArgument(&evaluated,&llibs,false);
    item = llibs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if ((cge.x_)->HadHeadSensitiveCondition == true) {
      impl->HadHeadSensitiveCondition = true;
    }
    for (; pbVar3 = llibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        item != llibs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; item = item + 1) {
      CheckCMP0004(&name,this,item);
      _Var4 = std::operator==(&name,&this->Target->Name);
      if ((_Var4) || (name._M_string_length == 0)) {
        _Var4 = std::operator==(&name,&this->Target->Name);
        if (_Var4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          PVar5 = GetPolicyStatusCMP0038(this);
          if (PVar5 != OLD) {
            t = FATAL_ERROR;
            if (PVar5 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_2d0,(cmPolicies *)0x26,id);
              poVar9 = std::operator<<((ostream *)&e,(string *)&local_2d0);
              std::operator<<(poVar9,"\n");
              std::__cxx11::string::~string((string *)&local_2d0);
              t = AUTHOR_WARNING;
            }
            poVar9 = std::operator<<((ostream *)&e,"Target \"");
            poVar9 = std::operator<<(poVar9,(string *)&this->Target->Name);
            std::operator<<(poVar9,"\" links to itself.");
            pcVar10 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
            std::__cxx11::stringbuf::str();
            GetBacktrace(&local_2d0,this);
            cmake::IssueMessage(pcVar10,t,&local_290,&local_2d0,false);
            cmListFileBacktrace::~cmListFileBacktrace(&local_2d0);
            std::__cxx11::string::~string((string *)&local_290);
            if (PVar5 != WARN) {
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              std::__cxx11::string::~string((string *)&name);
              goto LAB_003bb943;
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        }
      }
      else {
        pcVar8 = FindTargetToLink(this,&name);
        fromGenex = std::operator!=(&evaluated,__rhs._M_current);
        cmLinkImplItem::cmLinkImplItem((cmLinkImplItem *)&e,&name,pcVar8,local_398,fromGenex);
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::emplace_back<cmLinkImplItem>
                  ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)impl,
                   (cmLinkImplItem *)&e);
        cmLinkImplItem::~cmLinkImplItem((cmLinkImplItem *)&e);
      }
      std::__cxx11::string::~string((string *)&name);
    }
    psVar2 = &(cge.x_)->SeenTargetProperties;
    for (p_Var11 = ((cge.x_)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var11 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      pcVar7 = GetProperty(this,(string *)(p_Var11 + 1));
      if (pcVar7 == (char *)0x0) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->LinkImplicitNullProperties,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var11 + 1));
      }
    }
    cmCompiledGeneratorExpression::GetMaxLanguageStandard(cge.x_,this,&this->MaxLanguageStandards);
LAB_003bb943:
    std::__cxx11::string::~string((string *)&evaluated);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&debugConfigs);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&llibs);
    if (item != pbVar3) {
      return;
    }
    cVar12.End._M_current = local_360._M_current;
    cVar12.Begin._M_current = __rhs._M_current + 1;
    local_398 = local_398 + 1;
  } while( true );
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config,
  cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head) const
{
  cmStringRange entryRange =
      this->Target->GetLinkImplementationEntries();
  cmBacktraceRange btRange =
      this->Target->GetLinkImplementationBacktraces();
  cmBacktraceRange::const_iterator btIt = btRange.begin();
  // Collect libraries directly linked in this configuration.
  for (cmStringRange::const_iterator le = entryRange.begin(),
      end = entryRange.end(); le != end; ++le, ++btIt)
    {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
                                        this->GetName(),
                                        "LINK_LIBRARIES", 0, 0);
    cmGeneratorExpression ge(*btIt);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(*le);
    std::string const evaluated =
      cge->Evaluate(this->LocalGenerator, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if(cge->GetHadHeadSensitiveCondition())
      {
      impl.HadHeadSensitiveCondition = true;
      }

    for(std::vector<std::string>::const_iterator li = llibs.begin();
        li != llibs.end(); ++li)
      {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(*li);
      if(name == this->GetName() || name.empty())
        {
        if(name == this->GetName())
          {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch(this->GetPolicyStatusCMP0038())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }

          if(!noMessage)
            {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR)
              {
              return;
              }
            }
          }
        continue;
        }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(
        cmLinkImplItem(name, this->FindTargetToLink(name),
                       *btIt, evaluated != *le));
      }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
        it != seenProps.end(); ++it)
      {
      if (!this->GetProperty(*it))
        {
        this->LinkImplicitNullProperties.insert(*it);
        }
      }
    cge->GetMaxLanguageStandard(this,
                                this->MaxLanguageStandards);
    }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
      CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for(cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
      li != oldllibs.end(); ++li)
    {
    if(li->second != GENERAL_LibraryType && li->second != linkType)
      {
      std::string name = this->CheckCMP0004(li->first);
      if(name == this->GetName() || name.empty())
        {
        continue;
        }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, this->FindTargetToLink(name)));
      }
    }
}